

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave-common-sdl2.cpp
# Opt level: O0

bool GGWave_mainLoop(void)

{
  FILE *__stream;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  time_point tVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uchar *puVar8;
  element_type *peVar9;
  undefined8 uVar10;
  float fVar11;
  uint32_t nBytes;
  int nNeed;
  int nHave;
  time_point tNow;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  bool local_1;
  
  if (((anonymous_namespace)::g_devIdInp == 0) && ((anonymous_namespace)::g_devIdOut == 0)) {
    local_1 = false;
  }
  else {
    std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10882c);
    bVar1 = GGWave::txHasData();
    if ((bVar1 & 1) == 0) {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,0);
      if ((GGWave_mainLoop()::tLastNoData == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GGWave_mainLoop()::tLastNoData), iVar2 != 0)) {
        GGWave_mainLoop::tLastNoData.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        __cxa_guard_release(&GGWave_mainLoop()::tLastNoData);
      }
      tVar7.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      iVar2 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdOut);
      std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1088a6);
      iVar3 = GGWave::samplesPerFrame();
      std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1088be);
      iVar4 = GGWave::sampleSizeOut();
      if (iVar2 < iVar3 * iVar4) {
        SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,0);
        iVar2 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
        std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x108903
                  );
        iVar4 = GGWave::samplesPerFrame();
        std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10891b
                  );
        iVar3 = GGWave::sampleSizeInp();
        iVar4 = iVar4 * iVar3;
        fVar11 = getTime_ms<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if ((fVar11 <= 500.0) || (iVar2 < iVar4)) {
          SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
          tVar7 = GGWave_mainLoop::tLastNoData;
        }
        else {
          if ((GGWave_mainLoop()::dataInp == '\0') &&
             (iVar3 = __cxa_guard_acquire(&GGWave_mainLoop()::dataInp), iVar3 != 0)) {
            this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(long)iVar4;
            std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x108993);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
            std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1089b5);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &GGWave_mainLoop::dataInp,&__dso_handle);
            __cxa_guard_release(&GGWave_mainLoop()::dataInp);
          }
          iVar3 = (anonymous_namespace)::g_devIdInp;
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1089f1);
          SDL_DequeueAudio(iVar3,puVar8,iVar4);
          peVar9 = std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x108a0d);
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x108a1e);
          uVar5 = (uint)puVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&GGWave_mainLoop::dataInp);
          bVar1 = GGWave::decode(peVar9,uVar5);
          if ((bVar1 & 1) == 0) {
            fprintf(_stderr,"Warning: failed to decode input data!\n");
          }
          __stream = _stderr;
          tVar7.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
          if (iVar4 * 0x20 < iVar2) {
            uVar5 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
            fprintf(__stream,
                    "Warning: slow processing, clearing queued audio buffer of %d bytes ...\n",
                    (ulong)uVar5);
            SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
            tVar7 = GGWave_mainLoop::tLastNoData;
          }
        }
      }
    }
    else {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
      std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x108b1f);
      uVar6 = GGWave::encode();
      iVar2 = (anonymous_namespace)::g_devIdOut;
      std::__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<GGWave,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x108b41);
      uVar10 = GGWave::txWaveform();
      SDL_QueueAudio(iVar2,uVar10,uVar6);
      tVar7 = GGWave_mainLoop::tLastNoData;
    }
    GGWave_mainLoop::tLastNoData.__d.__r = tVar7.__d.__r;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GGWave_mainLoop() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    if (g_ggWave->txHasData() == false) {
        SDL_PauseAudioDevice(g_devIdOut, SDL_FALSE);

        static auto tLastNoData = std::chrono::high_resolution_clock::now();
        auto tNow = std::chrono::high_resolution_clock::now();

        if ((int) SDL_GetQueuedAudioSize(g_devIdOut) < g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeOut()) {
            SDL_PauseAudioDevice(g_devIdInp, SDL_FALSE);
            const int nHave = (int) SDL_GetQueuedAudioSize(g_devIdInp);
            const int nNeed = g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeInp();
            if (::getTime_ms(tLastNoData, tNow) > 500.0f && nHave >= nNeed) {
                static std::vector<uint8_t> dataInp(nNeed);
                SDL_DequeueAudio(g_devIdInp, dataInp.data(), nNeed);

                if (g_ggWave->decode(dataInp.data(), dataInp.size()) == false) {
                    fprintf(stderr, "Warning: failed to decode input data!\n");
                }

                if (nHave > 32*nNeed) {
                    fprintf(stderr, "Warning: slow processing, clearing queued audio buffer of %d bytes ...\n", SDL_GetQueuedAudioSize(g_devIdInp));
                    SDL_ClearQueuedAudio(g_devIdInp);
                }
            } else {
                SDL_ClearQueuedAudio(g_devIdInp);
            }
        } else {
            tLastNoData = tNow;
        }
    } else {
        SDL_PauseAudioDevice(g_devIdOut, SDL_TRUE);
        SDL_PauseAudioDevice(g_devIdInp, SDL_TRUE);

        const auto nBytes = g_ggWave->encode();
        SDL_QueueAudio(g_devIdOut, g_ggWave->txWaveform(), nBytes);
    }

    return true;
}